

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O3

result_type __thiscall
Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<-24>,_Detail::M3<30>,_Detail::M3<-10>,_Detail::M2<-26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::NoTempering>
::operator()(Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::NoTempering>
             *this)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  sVar1 = this->index_;
  uVar4 = sVar1 + 0x56e;
  if (((uVar4 < 0xade) && (uVar5 = sVar1 + 0x56d, uVar5 < 0xade)) &&
     (uVar9 = sVar1 + 0x17, uVar9 < 0xade)) {
    uVar7 = sVar1 - 2;
    if (uVar5 < 0x56f) {
      uVar7 = uVar5;
    }
    uVar5 = sVar1 - 1;
    if (uVar4 < 0x56f) {
      uVar5 = uVar4;
    }
    uVar4 = sVar1 - 0x558;
    if (uVar9 < 0x56f) {
      uVar4 = uVar9;
    }
    uVar9 = sVar1 - 0x38e;
    if (sVar1 + 0x1e1 < 0x56f) {
      uVar9 = sVar1 + 0x1e1;
    }
    uVar2 = (this->state_[uVar4] >> 0x1e | this->state_[sVar1] << 0x18) ^
            this->state_[sVar1] ^ this->state_[uVar4];
    uVar4 = sVar1 - 0x48a;
    if (sVar1 + 0xe5 < 0x56f) {
      uVar4 = sVar1 + 0xe5;
    }
    uVar6 = this->state_[uVar4] << 0x1a ^ this->state_[uVar9] << 10 ^ this->state_[uVar9];
    uVar8 = (uVar6 & 0x7dffff) << 9 | uVar6 >> 0x17;
    uVar3 = uVar8 ^ 0xb729fcec;
    if ((uVar6 >> 0x11 & 1) == 0) {
      uVar3 = uVar8;
    }
    uVar3 = uVar2 >> 0x14 ^ (this->state_[uVar7] & 0x7fff | this->state_[uVar5] & 0xffff8000) ^
            uVar6 ^ uVar3;
    this->state_[sVar1] = uVar6 ^ uVar2;
    this->state_[uVar5] = uVar3;
    this->index_ = uVar5;
    return uVar3;
  }
  __assert_fail("value < 2 * r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sehe[P]well-random/well.hpp"
                ,0x9e,
                "static T Detail::Modulo<unsigned long, 1391>::calc(T, std::false_type) [UIntType = unsigned long, r = 1391, T = unsigned long]"
               );
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }